

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O0

DynamicObject * __thiscall
JsrtDebuggerObjectScope::GetJSONObject
          (JsrtDebuggerObjectScope *this,ScriptContext *scriptContext,bool forceSetValueProp)

{
  uint value;
  JavascriptLibrary *this_00;
  DynamicObject *pDVar1;
  JsrtDebugPropertyId local_38;
  JsrtDebugPropertyId local_34;
  DynamicObject *local_30;
  DynamicObject *scopeObject;
  IDiagObjectModelDisplay *modelDisplay;
  ScriptContext *pSStack_18;
  bool forceSetValueProp_local;
  ScriptContext *scriptContext_local;
  JsrtDebuggerObjectScope *this_local;
  
  modelDisplay._7_1_ = forceSetValueProp;
  pSStack_18 = scriptContext;
  scriptContext_local = (ScriptContext *)this;
  scopeObject = (DynamicObject *)
                Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>::GetStrongReference
                          (this->objectDisplay);
  local_30 = (DynamicObject *)0x0;
  if (scopeObject != (DynamicObject *)0x0) {
    this_00 = Js::ScriptContext::GetLibrary(pSStack_18);
    pDVar1 = Js::JavascriptLibrary::CreateObject(this_00,false,0);
    local_30 = pDVar1;
    JsrtDebugPropertyId::JsrtDebugPropertyId(&local_34,index);
    JsrtDebugUtils::AddPropertyToObject(pDVar1,local_34,this->index,pSStack_18);
    pDVar1 = local_30;
    JsrtDebugPropertyId::JsrtDebugPropertyId(&local_38,handle);
    value = JsrtDebuggerObjectBase::GetHandle(&this->super_JsrtDebuggerObjectBase);
    JsrtDebugUtils::AddPropertyToObject(pDVar1,local_38,value,pSStack_18);
    Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>::ReleaseStrongReference
              (this->objectDisplay);
  }
  return local_30;
}

Assistant:

Js::DynamicObject * JsrtDebuggerObjectScope::GetJSONObject(Js::ScriptContext* scriptContext, bool forceSetValueProp)
{
    Js::IDiagObjectModelDisplay* modelDisplay = this->objectDisplay->GetStrongReference();

    Js::DynamicObject* scopeObject = nullptr;

    if (modelDisplay != nullptr)
    {
        scopeObject = scriptContext->GetLibrary()->CreateObject();
        JsrtDebugUtils::AddPropertyToObject(scopeObject, JsrtDebugPropertyId::index, this->index, scriptContext);
        JsrtDebugUtils::AddPropertyToObject(scopeObject, JsrtDebugPropertyId::handle, this->GetHandle(), scriptContext);

        this->objectDisplay->ReleaseStrongReference();
    }

    return scopeObject;
}